

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  byte *iEnd;
  U32 *pUVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  ldmEntry_t *plVar5;
  U64 UVar6;
  rawSeq *prVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  ldmParams_t ldmParams;
  BYTE *pBVar13;
  long lVar14;
  U32 UVar15;
  U32 maxDist;
  uint uVar16;
  U32 UVar17;
  U32 UVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong *src_00;
  byte *iStart;
  byte *pbVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong *puVar29;
  ulong *ip;
  U32 UVar30;
  ulong *puVar31;
  byte *pbVar32;
  ulong *puVar33;
  void *pvVar34;
  U32 hbits;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ldmEntry_t *plVar38;
  ulong *puVar39;
  U64 hash;
  BYTE *istart;
  uint local_208;
  ulong *local_200;
  BYTE *local_1d0;
  BYTE *local_198;
  ldmEntry_t *local_190;
  long local_140;
  size_t local_138;
  ulong local_130;
  int iStack_7c;
  
  maxDist = 1 << ((byte)params->windowLog & 0x1f);
  uVar9 = (ulong)((srcSize & 0xfffff) == 0);
  uVar10 = (srcSize >> 0x14) + 1;
  if ((ldmState->window).nextSrc < (ulong *)((long)src + srcSize)) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44ee,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar27 = sequences->size;
  if (uVar27 < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44f2,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < uVar27) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44f3,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (uVar10 != uVar9) {
    lVar35 = 0;
    uVar20 = 0;
    pvVar34 = src;
    do {
      if (sequences->capacity <= uVar27) {
        return 0;
      }
      src_00 = (ulong *)((long)src + lVar35 * 0x100000);
      puVar31 = src_00 + 0x20000;
      if (srcSize + lVar35 * -0x100000 < 0x100000) {
        puVar31 = (ulong *)((long)src + srcSize);
      }
      if ((long)srcSize <= lVar35 * 0x100000) {
        __assert_fail("chunkStart < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x44fd,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      local_1d0 = (ldmState->window).base;
      uVar16 = (int)puVar31 - (int)local_1d0;
      if (0xe0000000 < uVar16) {
        UVar15 = params->hashLog;
        UVar17 = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist,src_00);
        plVar5 = ldmState->hashTable;
        lVar28 = 0;
        do {
          uVar16 = plVar5[lVar28].offset;
          UVar30 = uVar16 - UVar17;
          if (uVar16 < UVar17) {
            UVar30 = 0;
          }
          plVar5[lVar28].offset = UVar30;
          lVar28 = lVar28 + 1;
        } while (1L << ((byte)UVar15 & 0x3f) != lVar28);
        local_1d0 = (ldmState->window).base;
        uVar16 = (int)puVar31 - (int)local_1d0;
      }
      local_208 = (ldmState->window).lowLimit;
      if (ldmState->loadedDictEnd + maxDist < uVar16) {
        uVar16 = uVar16 - maxDist;
        if (local_208 < uVar16) {
          (ldmState->window).lowLimit = uVar16;
          local_208 = uVar16;
        }
        uVar16 = (ldmState->window).dictLimit;
        if (uVar16 < local_208) {
          (ldmState->window).dictLimit = local_208;
          uVar16 = local_208;
        }
        ldmState->loadedDictEnd = 0;
      }
      else {
        uVar16 = (ldmState->window).dictLimit;
      }
      UVar15 = params->bucketSizeLog;
      UVar17 = params->hashRateLog;
      UVar30 = params->hashLog;
      uVar2 = params->minMatchLength;
      uVar37 = (ulong)uVar2;
      UVar6 = ldmState->hashPower;
      if (local_208 < uVar16) {
        local_198 = (ldmState->window).dictBase;
        uVar26 = local_208;
      }
      else {
        local_198 = (BYTE *)0x0;
        uVar26 = uVar16;
      }
      uVar36 = (long)puVar31 - (long)src_00;
      iEnd = (byte *)((long)src_00 + uVar36);
      uVar21 = 8;
      if (8 < uVar2) {
        uVar21 = (ulong)uVar2;
      }
      puVar39 = (ulong *)(iEnd + -uVar21);
      uVar21 = uVar36;
      local_200 = src_00;
      if (src_00 <= puVar39) {
        hbits = UVar30 - UVar15;
        iStart = local_1d0 + uVar16;
        puVar29 = (ulong *)0x0;
        hash = 0;
        ip = src_00;
        do {
          if (ip == src_00) {
            if (uVar2 == 0) {
              hash = 0;
            }
            else {
              uVar21 = 0;
              hash = 0;
              do {
                hash = hash * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar34 + uVar21) + 10;
                uVar21 = uVar21 + 1;
              } while (uVar37 != uVar21);
            }
          }
          else {
            hash = (hash - ((ulong)(byte)*puVar29 + 10) * UVar6) * -0x30e44323485a9b9d +
                   (ulong)*(byte *)((long)puVar29 + uVar37) + 10;
          }
          UVar18 = ZSTD_ldm_getTag(hash,hbits,UVar17);
          puVar29 = ip;
          if ((UVar18 ^ -1 << ((byte)UVar17 & 0x1f)) == 0xffffffff) {
            if (0x20 < hbits) {
              __assert_fail("numBits <= 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x437a,"U32 ZSTD_ldm_getSmallHash(U64, U32)");
            }
            iVar19 = (int)ip;
            UVar18 = iVar19 - (int)local_1d0;
            uVar21 = hash >> (0x40U - (char)hbits & 0x3f) & 0xffffffff;
            if (UVar30 == UVar15) {
              uVar21 = 0;
            }
            plVar38 = ldmState->hashTable + (uVar21 << ((byte)params->bucketSizeLog & 0x3f));
            plVar5 = plVar38 + (1L << ((byte)UVar15 & 0x3f));
            local_138 = 0;
            local_140 = 0;
            local_190 = (ldmEntry_t *)0x0;
            local_130 = 0;
            do {
              if (plVar38->checksum == (U32)(hash >> (0x20U - (char)hbits & 0x3f))) {
                uVar3 = plVar38->offset;
                uVar21 = (ulong)uVar3;
                if (uVar26 < uVar3) {
                  if (local_208 < uVar16) {
                    pbVar25 = iEnd;
                    pBVar13 = local_1d0;
                    if (uVar3 < uVar16) {
                      pbVar25 = local_198 + uVar16;
                      pBVar13 = local_198;
                    }
                    sVar22 = ZSTD_count_2segments((BYTE *)ip,pBVar13 + uVar21,iEnd,pbVar25,iStart);
                    if (uVar37 <= sVar22) {
                      pbVar25 = iStart;
                      if (uVar3 < uVar16) {
                        pbVar25 = local_198 + uVar26;
                      }
                      if ((local_200 < ip) && (pbVar25 < pBVar13 + uVar21)) {
                        pbVar32 = pBVar13 + uVar21;
                        lVar28 = 0;
                        puVar33 = (ulong *)((long)ip + -1);
                        do {
                          pbVar32 = pbVar32 + -1;
                          if (((byte)*puVar33 != *pbVar32) ||
                             (lVar28 = lVar28 + 1, puVar33 <= local_200)) break;
                          puVar33 = (ulong *)((long)puVar33 + -1);
                        } while (pbVar25 < pbVar32);
                        uVar21 = sVar22 + lVar28;
                      }
                      else {
                        lVar28 = 0;
                        uVar21 = sVar22;
                      }
LAB_00155fc2:
                      if (local_130 < uVar21) {
                        local_190 = plVar38;
                        local_140 = lVar28;
                        local_138 = sVar22;
                        local_130 = uVar21;
                      }
                    }
                  }
                  else {
                    puVar33 = (ulong *)(local_1d0 + uVar21);
                    puVar23 = ip;
                    if (ip < iEnd + -7) {
                      if (*puVar33 == *ip) {
                        lVar28 = 0;
                        do {
                          puVar23 = (ulong *)((long)ip + lVar28 + 8);
                          if (iEnd + -7 <= puVar23) {
                            puVar33 = (ulong *)(local_1d0 + lVar28 + uVar21 + 8);
                            goto LAB_00155ee6;
                          }
                          lVar14 = lVar28 + uVar21 + 8;
                          lVar28 = lVar28 + 8;
                        } while (*(ulong *)(local_1d0 + lVar14) == *puVar23);
                        uVar24 = *puVar23 ^ *(ulong *)(local_1d0 + lVar14);
                        uVar11 = 0;
                        if (uVar24 != 0) {
                          for (; (uVar24 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                          }
                        }
                        sVar22 = (uVar11 >> 3 & 0x1fffffff) + lVar28;
                      }
                      else {
                        uVar24 = *ip ^ *puVar33;
                        uVar11 = 0;
                        if (uVar24 != 0) {
                          for (; (uVar24 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                          }
                        }
                        sVar22 = uVar11 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00155ee6:
                      if ((puVar23 < iEnd + -3) && ((int)*puVar33 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar33 = (ulong *)((long)puVar33 + 4);
                      }
                      if ((puVar23 < iEnd + -1) && ((short)*puVar33 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar33 = (ulong *)((long)puVar33 + 2);
                      }
                      if (puVar23 < puVar31) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((byte)*puVar33 == (byte)*puVar23));
                      }
                      sVar22 = (long)puVar23 - (long)ip;
                    }
                    if (uVar37 <= sVar22) {
                      if ((local_200 < ip) && (uVar16 < uVar3)) {
                        lVar28 = 0;
                        puVar33 = (ulong *)((long)ip + -1);
                        pbVar25 = local_1d0 + (uVar21 - 1);
                        do {
                          if (((byte)*puVar33 != *pbVar25) ||
                             (lVar28 = lVar28 + 1, puVar33 <= local_200)) break;
                          puVar33 = (ulong *)((long)puVar33 + -1);
                          bVar8 = iStart < pbVar25;
                          pbVar25 = pbVar25 + -1;
                        } while (bVar8);
                        uVar21 = lVar28 + sVar22;
                      }
                      else {
                        lVar28 = 0;
                        uVar21 = sVar22;
                      }
                      goto LAB_00155fc2;
                    }
                  }
                }
              }
              plVar38 = plVar38 + 1;
            } while (plVar38 < plVar5);
            if (local_190 == (ldmEntry_t *)0x0) {
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar18,*params);
              puVar33 = (ulong *)((long)ip + 1);
            }
            else {
              sVar22 = sequences->size;
              if (sVar22 == sequences->capacity) {
                return 0xffffffffffffffba;
              }
              prVar7 = sequences->seq;
              UVar4 = local_190->offset;
              prVar7[sVar22].litLength = (iVar19 - (int)local_140) - (int)local_200;
              prVar7[sVar22].matchLength = (int)local_140 + (int)local_138;
              prVar7[sVar22].offset = UVar18 - UVar4;
              sequences->size = sVar22 + 1;
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar18,*params);
              local_200 = (ulong *)(local_138 + (long)ip);
              puVar33 = local_200;
              if (local_200 <= puVar39) {
                uVar12 = params->minMatchLength;
                ldmParams = *params;
                if (1 < (long)local_138) {
                  lVar28 = local_138 - 1;
                  UVar18 = (1 - (int)local_1d0) + iVar19;
                  do {
                    hash = (hash - ((ulong)(byte)*ip + 10) * ldmState->hashPower) *
                           -0x30e44323485a9b9d +
                           (ulong)*(byte *)((long)ip + (ulong)(uVar12 - 1) + 1) + 10;
                    ZSTD_ldm_makeEntryAndInsertByTag(ldmState,hash,hbits,UVar18,ldmParams);
                    ip = (ulong *)((long)ip + 1);
                    UVar18 = UVar18 + 1;
                    lVar28 = lVar28 + -1;
                  } while (lVar28 != 0);
                }
                puVar29 = (ulong *)((long)local_200 + -1);
              }
            }
          }
          else {
            puVar33 = (ulong *)((long)ip + 1);
          }
          ip = puVar33;
        } while (ip <= puVar39);
        uVar21 = (long)puVar31 - (long)local_200;
      }
      if (0xffffffffffffff88 < uVar21) {
        return uVar21;
      }
      uVar37 = sequences->size;
      if (uVar27 < uVar37) {
        pUVar1 = &sequences->seq[uVar27].litLength;
        *pUVar1 = *pUVar1 + (int)uVar20;
      }
      else {
        if (src_00 != local_200) {
          __assert_fail("newLeftoverSize == chunkSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x451c,
                        "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                       );
        }
        uVar21 = uVar36 + uVar20;
      }
      lVar35 = lVar35 + 1;
      pvVar34 = (void *)((long)pvVar34 + 0x100000);
      uVar20 = uVar21;
      uVar27 = uVar37;
    } while (lVar35 != uVar10 - uVar9);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}